

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::AddBuiltinCommand(cmState *this,string *name,cmCommand *command)

{
  __type _Var1;
  iterator iVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>
  pStack_48;
  
  cmsys::SystemTools::LowerCase(&pStack_48.first,name);
  _Var1 = std::operator==(name,&pStack_48.first);
  if (!_Var1) {
    __assert_fail("name == cmSystemTools::LowerCase(name)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,0x1aa,"void cmState::AddBuiltinCommand(const std::string &, cmCommand *)");
  }
  std::__cxx11::string::~string((string *)&pStack_48);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
          ::find(&(this->BuiltinCommands)._M_t,name);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->BuiltinCommands)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)&pStack_48,(string *)name);
    pStack_48.second = command;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,cmCommand*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                *)&this->BuiltinCommands,&pStack_48);
    std::__cxx11::string::~string((string *)&pStack_48);
    return;
  }
  __assert_fail("this->BuiltinCommands.find(name) == this->BuiltinCommands.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                ,0x1ab,"void cmState::AddBuiltinCommand(const std::string &, cmCommand *)");
}

Assistant:

void cmState::AddBuiltinCommand(std::string const& name, cmCommand* command)
{
  assert(name == cmSystemTools::LowerCase(name));
  assert(this->BuiltinCommands.find(name) == this->BuiltinCommands.end());
  this->BuiltinCommands.insert(std::make_pair(name, command));
}